

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::HlslParseContext::flattenAccess
          (HlslParseContext *this,longlong uniqueId,int member,TStorageQualifier outerStorage,
          TType *dereferencedType,int subset)

{
  longlong i;
  bool bVar1;
  iterator iVar2;
  TIntermSymbol *this_00;
  TType *s;
  _Rb_tree_color _Var3;
  longlong uniqueId_local;
  pool_allocator<char> local_60;
  TString local_58;
  
  uniqueId_local = uniqueId;
  iVar2 = std::
          _Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
          ::find((_Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                  *)&this->flattenMap,&uniqueId_local);
  this_00 = (TIntermSymbol *)0x0;
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->flattenMap).
       super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    if (subset < 1) {
      subset = 0;
    }
    _Var3 = (&(iVar2._M_node[2]._M_left)->_M_color)[subset + member];
    s = dereferencedType;
    bVar1 = shouldFlatten(this,dereferencedType,outerStorage,false);
    if (bVar1) {
      this_00 = (TIntermSymbol *)TIntermNode::operator_new((TIntermNode *)0x138,(size_t)s);
      i = uniqueId_local;
      local_60.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_58,"flattenShadow",&local_60);
      TIntermSymbol::TIntermSymbol
                (this_00,i,&local_58,(this->super_TParseContextBase).super_TParseVersions.language,
                 dereferencedType,(TString *)0x0);
    }
    else {
      this_00 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           *(TVariable **)
                            (&(iVar2._M_node[1]._M_left)->_M_color +
                            (long)(int)(&(iVar2._M_node[2]._M_left)->_M_color)[(int)_Var3] * 2));
      _Var3 = ~_S_red;
    }
    this_00->flattenSubset = _Var3;
  }
  return &this_00->super_TIntermTyped;
}

Assistant:

TIntermTyped* HlslParseContext::flattenAccess(long long uniqueId, int member, TStorageQualifier outerStorage,
    const TType& dereferencedType, int subset)
{
    const auto flattenData = flattenMap.find(uniqueId);

    if (flattenData == flattenMap.end())
        return nullptr;

    // Calculate new cumulative offset from the packed tree
    int newSubset = flattenData->second.offsets[subset >= 0 ? subset + member : member];

    TIntermSymbol* subsetSymbol;
    if (!shouldFlatten(dereferencedType, outerStorage, false)) {
        // Finished flattening: create symbol for variable
        member = flattenData->second.offsets[newSubset];
        const TVariable* memberVariable = flattenData->second.members[member];
        subsetSymbol = intermediate.addSymbol(*memberVariable);
        subsetSymbol->setFlattenSubset(-1);
    } else {

        // If this is not the final flattening, accumulate the position and return
        // an object of the partially dereferenced type.
        subsetSymbol = new TIntermSymbol(uniqueId, "flattenShadow", getLanguage(), dereferencedType);
        subsetSymbol->setFlattenSubset(newSubset);
    }

    return subsetSymbol;
}